

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<char> * __thiscall
cimg_library::CImgList<char>::get_append
          (CImg<char> *__return_storage_ptr__,CImgList<char> *this,char axis,float align)

{
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  CImg<char> *pCVar5;
  void *pvVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  CImg<char> *pCVar10;
  uint uVar11;
  uint uVar12;
  CImgList<char> *pCVar13;
  ulong uVar14;
  uint uVar15;
  int l;
  long lVar16;
  int l_2;
  uint uVar17;
  char local_4c [4];
  CImgList<char> *local_48;
  float local_3c;
  CImg<char> *local_38;
  
  pCVar10 = this->_data;
  uVar12 = this->_width;
  if (uVar12 == 0 || pCVar10 == (CImg<char> *)0x0) {
    __return_storage_ptr__->_data = (char *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else {
    uVar14 = (ulong)uVar12;
    local_3c = align;
    if (uVar12 == 1) {
      CImg<char>::CImg(__return_storage_ptr__,pCVar10,false);
    }
    else {
      __return_storage_ptr__->_data = (char *)0x0;
      __return_storage_ptr__->_width = 0;
      __return_storage_ptr__->_height = 0;
      __return_storage_ptr__->_depth = 0;
      __return_storage_ptr__->_spectrum = 0;
      __return_storage_ptr__->_is_shared = false;
      cVar7 = axis + ' ';
      if ((byte)(axis + 0xa5U) < 0xe6) {
        cVar7 = axis;
      }
      local_48 = this;
      local_38 = __return_storage_ptr__;
      if (cVar7 == 'x') {
        if ((int)uVar12 < 1) {
          uVar11 = 0;
          uVar15 = 0;
          uVar12 = 0;
          uVar17 = 0;
        }
        else {
          lVar9 = 0;
          uVar17 = 0;
          uVar12 = 0;
          uVar15 = 0;
          uVar11 = 0;
          do {
            if (*(long *)((long)&pCVar10->_data + lVar9) != 0) {
              uVar11 = uVar11 + *(int *)((long)&pCVar10->_width + lVar9);
              uVar2 = *(uint *)((long)&pCVar10->_height + lVar9);
              uVar3 = *(uint *)((long)&pCVar10->_depth + lVar9);
              if (uVar15 <= uVar2) {
                uVar15 = uVar2;
              }
              if (uVar12 <= uVar3) {
                uVar12 = uVar3;
              }
              uVar2 = *(uint *)((long)&pCVar10->_spectrum + lVar9);
              if (uVar17 <= uVar2) {
                uVar17 = uVar2;
              }
            }
            lVar9 = lVar9 + 0x20;
          } while (uVar14 << 5 != lVar9);
        }
        local_4c[3] = 0;
        pCVar10 = CImg<char>::assign(__return_storage_ptr__,uVar11,uVar15,uVar12,uVar17);
        CImg<char>::fill(pCVar10,local_4c + 3);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar9 = 0;
          lVar16 = 0;
          uVar14 = 0;
          pCVar13 = local_48;
          do {
            pCVar5 = pCVar13->_data;
            pCVar10 = (CImg<char> *)((long)&pCVar5->_width + lVar9);
            pvVar6 = *(void **)((long)&pCVar5->_data + lVar9);
            if (pvVar6 != (void *)0x0) {
              iVar4 = *(int *)((long)&pCVar5->_height + lVar9);
              iVar8 = *(int *)((long)&pCVar5->_depth + lVar9);
              if ((((iVar4 == 1) && (iVar8 == 1)) &&
                  (iVar8 = 1, *(int *)((long)&pCVar5->_spectrum + lVar9) == 1)) &&
                 (((local_38->_height == 1 && (local_38->_depth == 1)) && (local_38->_spectrum == 1)
                  ))) {
                memcpy(local_38->_data + uVar14,pvVar6,(ulong)pCVar10->_width);
                pCVar13 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)uVar14,(int)((float)(uVar15 - iVar4) * local_3c),
                           (int)((float)(uVar12 - iVar8) * local_3c),
                           (int)((float)(uVar17 - *(int *)((long)&pCVar5->_spectrum + lVar9)) *
                                local_3c),pCVar10,1.0);
                pCVar13 = local_48;
              }
            }
            uVar14 = (ulong)((int)uVar14 + pCVar10->_width);
            lVar16 = lVar16 + 1;
            lVar9 = lVar9 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar16 < (int)pCVar13->_width);
        }
      }
      else if (cVar7 == 'y') {
        if ((int)uVar12 < 1) {
          uVar12 = 0;
          uVar11 = 0;
          uVar15 = 0;
          uVar17 = 0;
        }
        else {
          lVar9 = 0;
          uVar17 = 0;
          uVar15 = 0;
          uVar11 = 0;
          uVar12 = 0;
          do {
            if (*(long *)((long)&pCVar10->_data + lVar9) != 0) {
              uVar2 = *(uint *)((long)&pCVar10->_width + lVar9);
              if (uVar12 <= uVar2) {
                uVar12 = uVar2;
              }
              uVar2 = *(uint *)((long)&pCVar10->_depth + lVar9);
              uVar11 = uVar11 + *(int *)((long)&pCVar10->_height + lVar9);
              if (uVar15 <= uVar2) {
                uVar15 = uVar2;
              }
              uVar2 = *(uint *)((long)&pCVar10->_spectrum + lVar9);
              if (uVar17 <= uVar2) {
                uVar17 = uVar2;
              }
            }
            lVar9 = lVar9 + 0x20;
          } while (uVar14 << 5 != lVar9);
        }
        local_4c[2] = 0;
        pCVar10 = CImg<char>::assign(__return_storage_ptr__,uVar12,uVar11,uVar15,uVar17);
        CImg<char>::fill(pCVar10,local_4c + 2);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar9 = 0;
          lVar16 = 0;
          uVar14 = 0;
          pCVar13 = local_48;
          do {
            pCVar10 = pCVar13->_data;
            pvVar6 = *(void **)((long)&pCVar10->_data + lVar9);
            if (pvVar6 != (void *)0x0) {
              iVar4 = *(int *)((long)&pCVar10->_width + lVar9);
              iVar8 = *(int *)((long)&pCVar10->_depth + lVar9);
              if ((((iVar8 == 1 && iVar4 == 1) &&
                   (iVar8 = 1, *(int *)((long)&pCVar10->_spectrum + lVar9) == 1)) &&
                  (local_38->_width == 1)) &&
                 ((local_38->_depth == 1 && (local_38->_spectrum == 1)))) {
                memcpy(local_38->_data + uVar14,pvVar6,
                       (ulong)*(uint *)((long)&pCVar10->_height + lVar9));
                pCVar13 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)((float)(uVar12 - iVar4) * local_3c),(int)uVar14,
                           (int)((float)(uVar15 - iVar8) * local_3c),
                           (int)((float)(uVar17 - *(int *)((long)&pCVar10->_spectrum + lVar9)) *
                                local_3c),(CImg<char> *)((long)&pCVar10->_width + lVar9),1.0);
                pCVar13 = local_48;
              }
            }
            uVar14 = (ulong)(uint)((int)uVar14 + *(int *)((long)&pCVar10->_height + lVar9));
            lVar16 = lVar16 + 1;
            lVar9 = lVar9 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar16 < (int)pCVar13->_width);
        }
      }
      else if (cVar7 == 'z') {
        if ((int)uVar12 < 1) {
          uVar12 = 0;
          uVar15 = 0;
          uVar11 = 0;
          uVar17 = 0;
        }
        else {
          lVar9 = 0;
          uVar17 = 0;
          uVar11 = 0;
          uVar15 = 0;
          uVar12 = 0;
          do {
            if (*(long *)((long)&pCVar10->_data + lVar9) != 0) {
              uVar2 = *(uint *)((long)&pCVar10->_width + lVar9);
              uVar3 = *(uint *)((long)&pCVar10->_height + lVar9);
              if (uVar12 <= uVar2) {
                uVar12 = uVar2;
              }
              if (uVar15 <= uVar3) {
                uVar15 = uVar3;
              }
              uVar11 = uVar11 + *(int *)((long)&pCVar10->_depth + lVar9);
              uVar2 = *(uint *)((long)&pCVar10->_spectrum + lVar9);
              if (uVar17 <= uVar2) {
                uVar17 = uVar2;
              }
            }
            lVar9 = lVar9 + 0x20;
          } while (uVar14 << 5 != lVar9);
        }
        local_4c[1] = 0;
        pCVar10 = CImg<char>::assign(__return_storage_ptr__,uVar12,uVar15,uVar11,uVar17);
        CImg<char>::fill(pCVar10,local_4c + 1);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar9 = 0;
          lVar16 = 0;
          uVar14 = 0;
          pCVar13 = local_48;
          do {
            pCVar10 = pCVar13->_data;
            pvVar6 = *(void **)((long)&pCVar10->_data + lVar9);
            if (pvVar6 != (void *)0x0) {
              iVar4 = *(int *)((long)&pCVar10->_width + lVar9);
              iVar8 = *(int *)((long)&pCVar10->_height + lVar9);
              if ((((iVar8 == 1 && iVar4 == 1) &&
                   (iVar8 = 1, *(int *)((long)&pCVar10->_spectrum + lVar9) == 1)) &&
                  (local_38->_width == 1)) &&
                 ((local_38->_height == 1 && (local_38->_spectrum == 1)))) {
                memcpy(local_38->_data + uVar14,pvVar6,
                       (ulong)*(uint *)((long)&pCVar10->_depth + lVar9));
                pCVar13 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)((float)(uVar12 - iVar4) * local_3c),
                           (int)((float)(uVar15 - iVar8) * local_3c),(int)uVar14,
                           (int)((float)(uVar17 - *(int *)((long)&pCVar10->_spectrum + lVar9)) *
                                local_3c),(CImg<char> *)((long)&pCVar10->_width + lVar9),1.0);
                pCVar13 = local_48;
              }
            }
            uVar14 = (ulong)(uint)((int)uVar14 + *(int *)((long)&pCVar10->_depth + lVar9));
            lVar16 = lVar16 + 1;
            lVar9 = lVar9 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar16 < (int)pCVar13->_width);
        }
      }
      else {
        if ((int)uVar12 < 1) {
          uVar12 = 0;
          uVar15 = 0;
          uVar17 = 0;
          uVar11 = 0;
        }
        else {
          lVar9 = 0;
          uVar11 = 0;
          uVar17 = 0;
          uVar15 = 0;
          uVar12 = 0;
          do {
            if (*(long *)((long)&pCVar10->_data + lVar9) != 0) {
              uVar2 = *(uint *)((long)&pCVar10->_width + lVar9);
              uVar3 = *(uint *)((long)&pCVar10->_height + lVar9);
              if (uVar12 <= uVar2) {
                uVar12 = uVar2;
              }
              if (uVar15 <= uVar3) {
                uVar15 = uVar3;
              }
              uVar2 = *(uint *)((long)&pCVar10->_depth + lVar9);
              if (uVar17 <= uVar2) {
                uVar17 = uVar2;
              }
              uVar11 = uVar11 + *(int *)((long)&pCVar10->_spectrum + lVar9);
            }
            lVar9 = lVar9 + 0x20;
          } while (uVar14 << 5 != lVar9);
        }
        local_4c[0] = '\0';
        pCVar10 = CImg<char>::assign(__return_storage_ptr__,uVar12,uVar15,uVar17,uVar11);
        CImg<char>::fill(pCVar10,local_4c);
        ppcVar1 = &__return_storage_ptr__->_data;
        __return_storage_ptr__ = local_38;
        if ((*ppcVar1 != (char *)0x0) && (0 < (int)local_48->_width)) {
          lVar9 = 0;
          lVar16 = 0;
          uVar14 = 0;
          pCVar13 = local_48;
          do {
            pCVar10 = pCVar13->_data;
            pvVar6 = *(void **)((long)&pCVar10->_data + lVar9);
            if (pvVar6 != (void *)0x0) {
              iVar4 = *(int *)((long)&pCVar10->_width + lVar9);
              iVar8 = *(int *)((long)&pCVar10->_height + lVar9);
              if ((((iVar8 == 1 && iVar4 == 1) &&
                   (iVar8 = 1, *(int *)((long)&pCVar10->_depth + lVar9) == 1)) &&
                  (local_38->_width == 1)) && ((local_38->_height == 1 && (local_38->_depth == 1))))
              {
                memcpy(local_38->_data + uVar14,pvVar6,
                       (ulong)*(uint *)((long)&pCVar10->_spectrum + lVar9));
                pCVar13 = local_48;
              }
              else {
                CImg<char>::draw_image
                          (local_38,(int)((float)(uVar12 - iVar4) * local_3c),
                           (int)((float)(uVar15 - iVar8) * local_3c),
                           (int)((float)(uVar17 - *(int *)((long)&pCVar10->_depth + lVar9)) *
                                local_3c),(int)uVar14,(CImg<char> *)((long)&pCVar10->_width + lVar9)
                           ,1.0);
                pCVar13 = local_48;
              }
            }
            uVar14 = (ulong)(uint)((int)uVar14 + *(int *)((long)&pCVar10->_spectrum + lVar9));
            lVar16 = lVar16 + 1;
            lVar9 = lVar9 + 0x20;
            __return_storage_ptr__ = local_38;
          } while (lVar16 < (int)pCVar13->_width);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::lowercase(axis)) {
      case 'x' : { // Along the X-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._height==1 && img._depth==1 && img._spectrum==1 &&
                  res._height==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._width);
              else
                res.draw_image(pos,
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy+=img._height;
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._depth==1 && img._spectrum==1 &&
                  res._width==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._height);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               pos,
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz+=img._depth;
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._spectrum==1 &&
                  res._width==1 && res._height==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._depth);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               pos,
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._depth==1 &&
                  res._width==1 && res._height==1 && res._depth==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._spectrum);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               pos,
                               img);
            }
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }